

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replace_desc_array_access_using_var_index.cpp
# Opt level: O0

void __thiscall
spvtools::opt::ReplaceDescArrayAccessUsingVarIndex::AddSwitchForAccessChain
          (ReplaceDescArrayAccessUsingVarIndex *this,BasicBlock *parent_block,
          uint32_t access_chain_index_var_id,uint32_t default_id,uint32_t merge_id,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *case_block_ids)

{
  initializer_list<unsigned_int> init_list;
  uint uVar1;
  IRContext *context;
  size_type sVar2;
  const_reference __args_1;
  uint local_ac;
  iterator local_a8;
  undefined8 local_a0;
  SmallVector<unsigned_int,_2UL> local_98;
  uint local_6c;
  undefined1 local_68 [4];
  uint32_t i;
  vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  cases;
  InstructionBuilder builder;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *case_block_ids_local;
  uint32_t merge_id_local;
  uint32_t default_id_local;
  uint32_t access_chain_index_var_id_local;
  BasicBlock *parent_block_local;
  ReplaceDescArrayAccessUsingVarIndex *this_local;
  
  context = Pass::context(&this->super_Pass);
  InstructionBuilder::InstructionBuilder
            ((InstructionBuilder *)
             &cases.
              super__Vector_base<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,context,parent_block,
             (anonymous_namespace)::kAnalysisDefUseAndInstrToBlockMapping);
  std::
  vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  ::vector((vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
            *)local_68);
  local_6c = 0;
  while( true ) {
    uVar1 = local_6c;
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(case_block_ids);
    if ((uint)sVar2 <= uVar1) break;
    local_ac = local_6c;
    local_a8 = &local_ac;
    local_a0 = 1;
    init_list._M_len = 1;
    init_list._M_array = local_a8;
    utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_98,init_list);
    __args_1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (case_block_ids,(ulong)local_6c);
    std::
    vector<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>,std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>>>
    ::emplace_back<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int_const&>
              ((vector<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>,std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,2ul>,unsigned_int>>>
                *)local_68,&local_98,__args_1);
    utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_98);
    local_6c = local_6c + 1;
  }
  InstructionBuilder::AddSwitch
            ((InstructionBuilder *)
             &cases.
              super__Vector_base<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,access_chain_index_var_id,
             default_id,
             (vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
              *)local_68,merge_id,0);
  std::
  vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
  ::~vector((vector<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>,_std::allocator<std::pair<spvtools::utils::SmallVector<unsigned_int,_2UL>,_unsigned_int>_>_>
             *)local_68);
  return;
}

Assistant:

void ReplaceDescArrayAccessUsingVarIndex::AddSwitchForAccessChain(
    BasicBlock* parent_block, uint32_t access_chain_index_var_id,
    uint32_t default_id, uint32_t merge_id,
    const std::vector<uint32_t>& case_block_ids) const {
  InstructionBuilder builder{context(), parent_block,
                             kAnalysisDefUseAndInstrToBlockMapping};
  std::vector<std::pair<Operand::OperandData, uint32_t>> cases;
  for (uint32_t i = 0; i < static_cast<uint32_t>(case_block_ids.size()); ++i) {
    cases.emplace_back(Operand::OperandData{i}, case_block_ids[i]);
  }
  builder.AddSwitch(access_chain_index_var_id, default_id, cases, merge_id);
}